

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_manyvec.c
# Opt level: O2

int fi(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  int iVar6;
  undefined8 uVar7;
  void *flagvalue;
  void *flagvalue_00;
  void *flagvalue_01;
  undefined8 *flagvalue_02;
  undefined8 *flagvalue_03;
  undefined8 *flagvalue_04;
  int iVar8;
  long lVar9;
  
  lVar5 = *user_data;
  dVar1 = *(double *)((long)user_data + 0x10);
  dVar2 = *(double *)((long)user_data + 0x18);
  dVar3 = *(double *)((long)user_data + 0x38);
  uVar7 = N_VGetSubvector_ManyVector(y,0);
  flagvalue = (void *)N_VGetArrayPointer(uVar7);
  iVar6 = check_flag(flagvalue,"N_VGetArrayPointer",0);
  iVar8 = 1;
  if (iVar6 == 0) {
    uVar7 = N_VGetSubvector_ManyVector(y,1);
    flagvalue_00 = (void *)N_VGetArrayPointer(uVar7);
    iVar6 = check_flag(flagvalue_00,"N_VGetArrayPointer",0);
    if (iVar6 == 0) {
      uVar7 = N_VGetSubvector_ManyVector(y,2);
      flagvalue_01 = (void *)N_VGetArrayPointer(uVar7);
      iVar6 = check_flag(flagvalue_01,"N_VGetArrayPointer",0);
      if (iVar6 == 0) {
        uVar7 = N_VGetSubvector_ManyVector(ydot,0);
        flagvalue_02 = (undefined8 *)N_VGetArrayPointer(uVar7);
        iVar6 = check_flag(flagvalue_02,"N_VGetArrayPointer",0);
        if (iVar6 == 0) {
          lVar9 = 1;
          uVar7 = N_VGetSubvector_ManyVector(ydot,1);
          flagvalue_03 = (undefined8 *)N_VGetArrayPointer(uVar7);
          iVar6 = check_flag(flagvalue_03,"N_VGetArrayPointer",0);
          if (iVar6 == 0) {
            uVar7 = N_VGetSubvector_ManyVector(ydot,2);
            flagvalue_04 = (undefined8 *)N_VGetArrayPointer(uVar7);
            iVar6 = check_flag(flagvalue_04,"N_VGetArrayPointer",0);
            if (iVar6 == 0) {
              N_VConst(0,ydot);
              for (; lVar9 < lVar5 + -1; lVar9 = lVar9 + 1) {
                dVar4 = *(double *)((long)flagvalue + lVar9 * 8);
                flagvalue_02[lVar9] =
                     *(double *)((long)flagvalue_00 + lVar9 * 8) * dVar4 * dVar4 +
                     (dVar1 - (*(double *)((long)flagvalue_01 + lVar9 * 8) + 1.0) * dVar4);
                dVar4 = *(double *)((long)flagvalue + lVar9 * 8);
                flagvalue_03[lVar9] =
                     dVar4 * *(double *)((long)flagvalue_01 + lVar9 * 8) -
                     *(double *)((long)flagvalue_00 + lVar9 * 8) * dVar4 * dVar4;
                dVar4 = *(double *)((long)flagvalue_01 + lVar9 * 8);
                flagvalue_04[lVar9] =
                     (dVar2 - dVar4) / dVar3 - dVar4 * *(double *)((long)flagvalue + lVar9 * 8);
              }
              *flagvalue_04 = 0;
              *flagvalue_03 = 0;
              *flagvalue_02 = 0;
              flagvalue_04[lVar5 + -1] = 0;
              flagvalue_03[lVar5 + -1] = 0;
              flagvalue_02[lVar5 + -1] = 0;
              iVar8 = 0;
            }
          }
        }
      }
    }
  }
  return iVar8;
}

Assistant:

static int fi(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData userdata = (UserData)user_data; /* access problem data */
  sunindextype N    = userdata->N;         /* set variable shortcuts */
  sunrealtype a     = userdata->a;
  sunrealtype b     = userdata->b;
  sunrealtype ep    = userdata->ep;
  sunrealtype *y_u = NULL, *y_v = NULL, *y_w = NULL;
  sunrealtype *f_u = NULL, *f_v = NULL, *f_w = NULL;
  sunindextype i;

  y_u = N_VGetArrayPointer(N_VGetSubvector_ManyVector(y, 0));
  if (check_flag((void*)y_u, "N_VGetArrayPointer", 0)) { return 1; }
  y_v = N_VGetArrayPointer(N_VGetSubvector_ManyVector(y, 1));
  if (check_flag((void*)y_v, "N_VGetArrayPointer", 0)) { return 1; }
  y_w = N_VGetArrayPointer(N_VGetSubvector_ManyVector(y, 2));
  if (check_flag((void*)y_w, "N_VGetArrayPointer", 0)) { return 1; }

  f_u = N_VGetArrayPointer(N_VGetSubvector_ManyVector(ydot, 0));
  if (check_flag((void*)f_u, "N_VGetArrayPointer", 0)) { return 1; }
  f_v = N_VGetArrayPointer(N_VGetSubvector_ManyVector(ydot, 1));
  if (check_flag((void*)f_v, "N_VGetArrayPointer", 0)) { return 1; }
  f_w = N_VGetArrayPointer(N_VGetSubvector_ManyVector(ydot, 2));
  if (check_flag((void*)f_w, "N_VGetArrayPointer", 0)) { return 1; }

  N_VConst(0.0, ydot); /* initialize ydot to zero */

  /* iterate over domain, computing all equations */
  for (i = 1; i < N - 1; i++)
  {
    /* Fill in ODE RHS for u */
    f_u[i] = a - (y_w[i] + ONE) * y_u[i] + y_v[i] * y_u[i] * y_u[i];

    /* Fill in ODE RHS for v */
    f_v[i] = y_w[i] * y_u[i] - y_v[i] * y_u[i] * y_u[i];

    /* Fill in ODE RHS for w */
    f_w[i] = (b - y_w[i]) / ep - y_w[i] * y_u[i];
  }

  /* enforce stationary boundaries */
  f_u[0] = f_v[0] = f_w[0] = ZERO;
  f_u[N - 1] = f_v[N - 1] = f_w[N - 1] = ZERO;

  return 0; /* Return with success */
}